

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::quath>(GeomPrimvar *this,quath *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  void *pvVar3;
  uint32_t uVar4;
  quath *pqVar5;
  quath qVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar8;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (quath *)0x0) {
joined_r0x001c5291:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar8 = false;
      }
      else {
        uVar4 = (*pvVar1->type_id)();
        bVar8 = uVar4 == 4;
      }
      if ((bVar8) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001c5291;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar1->type_id)(), uVar4 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar1->type_id)(), uVar4 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar8 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        cVar7 = !bVar8;
        if (bVar8) {
          if (err == (string *)0x0) {
            return (bool)cVar7;
          }
          std::__cxx11::string::append((char *)err);
          return (bool)cVar7;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pqVar5 = tinyusdz::value::Value::as<tinyusdz::value::quath>(&pSVar2->value,false);
        if (pqVar5 != (quath *)0x0) {
          qVar6 = *pqVar5;
          goto LAB_001c539e;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar4 = Attribute::type_id(this_00);
      bVar8 = IsSupportedGeomPrimvarType(uVar4);
      if (bVar8) {
        primvar::PrimVar::get_value<tinyusdz::value::quath>
                  ((optional<tinyusdz::value::quath> *)&local_78,&(this->_attr)._var);
        bVar8 = local_78._M_dataplus._M_p._0_1_;
        if (local_78._M_dataplus._M_p._0_1_ != true) {
          if (err == (string *)0x0) {
            return local_78._M_dataplus._M_p._0_1_;
          }
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_54._0_4_ = 0x30;
          Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    (&local_78,(fmt *)local_98,(string *)local_54,(uint *)(local_54 + 4),in_R8);
          std::__cxx11::string::_M_append
                    ((char *)err,
                     CONCAT62(local_78._M_dataplus._M_p._2_6_,
                              CONCAT11(local_78._M_dataplus._M_p._1_1_,
                                       local_78._M_dataplus._M_p._0_1_)));
          pvVar3 = (void *)CONCAT62(local_78._M_dataplus._M_p._2_6_,
                                    CONCAT11(local_78._M_dataplus._M_p._1_1_,
                                             local_78._M_dataplus._M_p._0_1_));
          if (pvVar3 != (void *)((long)&local_78 + 0x10)) {
            operator_delete(pvVar3,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_54._4_8_ != &local_40) {
            operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
          }
          if (local_98[0] == local_88) {
            return bVar8;
          }
          operator_delete(local_98[0],local_88[0] + 1);
          return bVar8;
        }
        qVar6.real.value = (undefined2)local_78._M_string_length;
        qVar6.imag._M_elems[0].value = local_78._M_dataplus._M_p._2_2_;
        qVar6.imag._M_elems[1].value = local_78._M_dataplus._M_p._4_2_;
        qVar6.imag._M_elems[2].value = local_78._M_dataplus._M_p._6_2_;
        cVar7 = true;
LAB_001c539e:
        *dest = qVar6;
        return (bool)cVar7;
      }
      if (err != (string *)0x0) {
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>(&local_78,(fmt *)local_98,(string *)(local_54 + 4),in_RCX)
        ;
        std::__cxx11::string::_M_append
                  ((char *)err,
                   CONCAT62(local_78._M_dataplus._M_p._2_6_,
                            CONCAT11(local_78._M_dataplus._M_p._1_1_,local_78._M_dataplus._M_p._0_1_
                                    )));
        pvVar3 = (void *)CONCAT62(local_78._M_dataplus._M_p._2_6_,
                                  CONCAT11(local_78._M_dataplus._M_p._1_1_,
                                           local_78._M_dataplus._M_p._0_1_));
        if (pvVar3 != (void *)((long)&local_78 + 0x10)) {
          operator_delete(pvVar3,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}